

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlparser.cpp
# Opt level: O1

void __thiscall ControlParser::ControlParser(ControlParser *this)

{
  std::__cxx11::istringstream::istringstream((istringstream *)this);
  this->controlType = -1;
  this->link = (Link *)0x0;
  this->linkStatus = 2;
  this->nodeSetting = 0.0;
  this->linkSetting = 0.0;
  this->node = (Node *)0x0;
  this->levelType = 0;
  this->timeSetting = -1;
  return;
}

Assistant:

ControlParser::ControlParser()
{
    initializeControlSettings();
}